

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

int __thiscall
ktx::ValidationContext::validate(ValidationContext *this,bool doCreateAndTranscodeChecks)

{
  validateHeader(this);
  validateIndices(this);
  calculateExpectedDFD(this,(this->header).vkFormat);
  validateDFD(this);
  validateLevelIndex(this);
  validateKVD(this);
  validateSGD(this);
  validatePaddings(this);
  if (doCreateAndTranscodeChecks) {
    validateCreateAndTranscode(this);
  }
  return this->returnCode;
}

Assistant:

int ValidationContext::validate(bool doCreateAndTranscodeChecks) {
    const auto call = [&](const auto& fn, std::string_view name, auto&&... args) {
        try {
            (this->*fn)(std::forward<decltype(args)>(args)...);
        } catch (const std::bad_alloc& ex) {
            error(System::OutOfMemory, name, ex.what());
        }
    };

    call(&ValidationContext::validateHeader, "Header");
    call(&ValidationContext::validateIndices, "Index");
    call(&ValidationContext::calculateExpectedDFD, "Expected DFD", VkFormat(header.vkFormat));
    call(&ValidationContext::validateDFD, "DFD");
    call(&ValidationContext::validateLevelIndex, "Level Index"); // Must come after the DFD parsed
    call(&ValidationContext::validateKVD, "KVD");
    call(&ValidationContext::validateSGD, "SGD");
    call(&ValidationContext::validatePaddings, "padding");
    if (doCreateAndTranscodeChecks)
        call(&ValidationContext::validateCreateAndTranscode, "Create and Transcode");

    return returnCode;
}